

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::reDim(SPxSolverBase<double> *this)

{
  uint uVar1;
  int iVar2;
  pointer pUVar3;
  UpdateVector<double> *pUVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 *local_38;
  undefined4 local_30;
  undefined8 local_28;
  uint local_20;
  
  uVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  uVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  if ((int)uVar7 < (int)uVar1) {
    uVar7 = uVar1;
  }
  if ((int)((ulong)((long)(this->unitVecs).data.
                          super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->unitVecs).data.
                         super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) < (int)uVar7) {
    std::vector<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>::
    resize(&(this->unitVecs).data,(long)(int)uVar7);
    if (0 < (int)uVar7) {
      local_38 = &local_28;
      uVar6 = (ulong)uVar7 + 1;
      lVar5 = (ulong)uVar7 << 5;
      do {
        uVar7 = uVar7 - 1;
        local_30 = 1;
        local_28 = 0x3ff0000000000000;
        pUVar3 = (this->unitVecs).data.
                 super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((undefined8 **)((long)&pUVar3[-1].super_SVectorBase<double>.m_elem + lVar5) != &local_38
           ) {
          *(uint *)((long)&pUVar3[-1].themem.idx + lVar5) = uVar7;
          *(undefined8 *)((long)&pUVar3[-1].themem.val + lVar5) = 0x3ff0000000000000;
          *(undefined4 *)((long)&pUVar3[-1].super_SVectorBase<double>.memused + lVar5) = 1;
        }
        uVar6 = uVar6 - 1;
        lVar5 = lVar5 + -0x20;
        local_20 = uVar7;
      } while (1 < uVar6);
    }
  }
  if (this->initialized == true) {
    VectorBase<double>::reDim(this->theFrhs,(this->thecovectors->set).thenum,true);
    pUVar4 = this->theFvec;
    iVar2 = (this->thecovectors->set).thenum;
    VectorBase<double>::reDim(&pUVar4->super_VectorBase<double>,iVar2,true);
    SSVectorBase<double>::reDim(&pUVar4->thedelta,iVar2);
    pUVar4 = this->thePvec;
    iVar2 = (this->thevectors->set).thenum;
    VectorBase<double>::reDim(&pUVar4->super_VectorBase<double>,iVar2,true);
    SSVectorBase<double>::reDim(&pUVar4->thedelta,iVar2);
    VectorBase<double>::reDim(this->theCoPrhs,(this->thecovectors->set).thenum,true);
    pUVar4 = this->theCoPvec;
    iVar2 = (this->thecovectors->set).thenum;
    VectorBase<double>::reDim(&pUVar4->super_VectorBase<double>,iVar2,true);
    SSVectorBase<double>::reDim(&pUVar4->thedelta,iVar2);
    VectorBase<double>::reDim(&this->theTest,(this->thevectors->set).thenum,true);
    VectorBase<double>::reDim(&this->theCoTest,(this->thecovectors->set).thenum,true);
    VectorBase<double>::reDim
              (&this->theURbound,
               (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theLRbound,
               (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theUCbound,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theLCbound,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim(&this->theUBbound,(this->thecovectors->set).thenum,true);
    VectorBase<double>::reDim(&this->theLBbound,(this->thecovectors->set).thenum,true);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reDim()
   {

      int newsize = SPxLPBase<R>::nCols() > SPxLPBase<R>::nRows() ? SPxLPBase<R>::nCols() :
                    SPxLPBase<R>::nRows();

      if(newsize > unitVecs.size())
      {
         unitVecs.reSize(newsize);

         while(newsize-- > 0)
            unitVecs[newsize] = UnitVectorBase<R>(newsize);
      }

      if(isInitialized())
      {
         theFrhs->reDim(dim());
         theFvec->reDim(dim());
         thePvec->reDim(coDim());

         theCoPrhs->reDim(dim());
         theCoPvec->reDim(dim());

         theTest.reDim(coDim());
         theCoTest.reDim(dim());

         theURbound.reDim(SPxLPBase<R>::nRows());
         theLRbound.reDim(SPxLPBase<R>::nRows());
         theUCbound.reDim(SPxLPBase<R>::nCols());
         theLCbound.reDim(SPxLPBase<R>::nCols());
         theUBbound.reDim(dim());
         theLBbound.reDim(dim());
      }
   }